

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getVectorArrayCtr_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this,GLuint columns,GLuint size)

{
  GLuint column;
  undefined1 local_50 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (columns != 0) {
    column = 0;
    do {
      getVectorConstructor_abi_cxx11_((string *)local_50,this,column,size);
      this = (InitializerListTest *)local_50._0_8_;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_50._0_8_);
      if ((InitializerListTest *)local_50._0_8_ != (InitializerListTest *)(local_50 + 0x10)) {
        this = (InitializerListTest *)(local_50._16_8_ + 1);
        operator_delete((void *)local_50._0_8_,(ulong)this);
      }
      column = column + 1;
      if (column < columns) {
        this = (InitializerListTest *)0x1a8a360;
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    } while (columns != column);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getVectorArrayCtr(GLuint columns, GLuint size)
{
	std::string result;

	for (GLuint col = 0; col < columns; ++col)
	{
		result.append(getVectorConstructor(col, size));

		if (col + 1 < columns)
		{
			result.append(", ");
		}
	}

	return result;
}